

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

void yy_2_list_prefix_expr(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  G->ss = G->val[-2];
  return;
}

Assistant:

YY_ACTION(void) yy_2_list_prefix_expr(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define r G->val[-1]
#define l G->val[-2]
#define b G->val[-3]
#define a G->val[-4]
  yyprintf((stderr, "do yy_2_list_prefix_expr"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy=l; }\n"));
  yy=l; ;
#undef r
#undef l
#undef b
#undef a
}